

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

int EventThread(ALCcontext *context)

{
  code *pcVar1;
  uint uVar2;
  int iVar3;
  AsyncEvent *__src;
  undefined4 uVar4;
  uint *puVar5;
  undefined8 uVar6;
  size_t sVar7;
  pointer __stat_loc;
  long in_RDI;
  string msg_1;
  string msg;
  ALbitfieldSOFT enabledevts;
  AsyncEvent evt;
  AsyncEvent *evt_ptr;
  lock_guard<std::mutex> _;
  ll_ringbuffer_data evt_data;
  bool quitnow;
  RingBuffer *ring;
  memory_order __b;
  mutex_type *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  intrusive_ref<EffectState> *in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  char *local_210;
  char *local_208;
  char *local_200;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  uint local_180;
  uint local_170 [2];
  uint local_168;
  int iStack_164;
  undefined4 local_160;
  intrusive_ref<EffectState> local_15c [59];
  AsyncEvent *local_70;
  AsyncEvent *local_60;
  long local_58;
  AsyncEvent *local_40;
  long local_38;
  byte local_29;
  pointer local_28;
  long local_20;
  uint local_14;
  memory_order local_10;
  int local_c;
  uint *local_8;
  
  local_20 = in_RDI;
  local_28 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::get
                       ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  local_29 = 0;
  do {
    while( true ) {
      if (((local_29 ^ 0xff) & 1) == 0) {
        return 0;
      }
      __stat_loc = local_28;
      RingBuffer::getReadVector
                ((RingBuffer *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      local_40 = local_60;
      local_38 = local_58;
      if (local_58 != 0) break;
      al::semaphore::wait((semaphore *)(local_20 + 400),__stat_loc);
    }
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    do {
      __src = local_40;
      local_70 = local_40;
      local_40 = local_40 + 1;
      local_38 = local_38 + -1;
      memcpy(local_170,__src,0x100);
      al::destroy_at<AsyncEvent>(local_70);
      RingBuffer::readAdvance(local_28,1);
      local_29 = local_170[0] == 0;
      if ((bool)local_29) break;
      if (local_170[0] == 0x10000) {
        al::intrusive_ref<EffectState>::release(in_stack_fffffffffffffda0);
      }
      else {
        puVar5 = (uint *)(local_20 + 0x1b8);
        local_c = 2;
        local_8 = puVar5;
        local_10 = std::operator&(memory_order_acquire,__memory_order_mask);
        if (local_c - 1U < 2) {
          local_14 = *puVar5;
        }
        else if (local_c == 5) {
          local_14 = *puVar5;
        }
        else {
          local_14 = *puVar5;
        }
        local_180 = local_14;
        if (*(long *)(local_20 + 0x1e8) != 0) {
          if (local_170[0] == 1) {
            if ((local_14 & 1) != 0) {
              std::__cxx11::to_string(in_stack_fffffffffffffdbc);
              std::operator+((char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
              std::__cxx11::string::~string(local_1c0);
              std::__cxx11::string::operator+=(local_1a0," state has changed to ");
              if (iStack_164 == 0x1011) {
                local_200 = "AL_INITIAL";
              }
              else {
                if (iStack_164 == 0x1012) {
                  local_208 = "AL_PLAYING";
                }
                else {
                  if (iStack_164 == 0x1013) {
                    local_210 = "AL_PAUSED";
                  }
                  else {
                    local_210 = "<unknown>";
                    if (iStack_164 == 0x1014) {
                      local_210 = "AL_STOPPED";
                    }
                  }
                  local_208 = local_210;
                }
                local_200 = local_208;
              }
              std::__cxx11::string::operator+=(local_1a0,local_200);
              uVar2 = local_168;
              pcVar1 = *(code **)(local_20 + 0x1e8);
              in_stack_fffffffffffffde0 = iStack_164;
              in_stack_fffffffffffffde4 = std::__cxx11::string::length();
              uVar6 = std::__cxx11::string::c_str();
              (*pcVar1)(0x19a5,uVar2,in_stack_fffffffffffffde0,in_stack_fffffffffffffde4,uVar6,
                        *(undefined8 *)(local_20 + 0x1f0));
              std::__cxx11::string::~string(local_1a0);
            }
          }
          else if (local_170[0] == 2) {
            if ((local_14 & 2) != 0) {
              std::__cxx11::to_string(in_stack_fffffffffffffdbc);
              if (iStack_164 == 1) {
                std::__cxx11::string::operator+=(local_1e0," buffer completed");
              }
              else {
                std::__cxx11::string::operator+=(local_1e0," buffers completed");
              }
              iVar3 = iStack_164;
              pcVar1 = *(code **)(local_20 + 0x1e8);
              in_stack_fffffffffffffdbc = local_168;
              uVar4 = std::__cxx11::string::length();
              uVar6 = std::__cxx11::string::c_str();
              (*pcVar1)(0x19a4,in_stack_fffffffffffffdbc,iVar3,uVar4,uVar6,
                        *(undefined8 *)(local_20 + 0x1f0));
              std::__cxx11::string::~string(local_1e0);
            }
          }
          else if ((local_14 & local_170[0]) == local_170[0]) {
            pcVar1 = *(code **)(local_20 + 0x1e8);
            in_stack_fffffffffffffda0 = local_15c;
            in_stack_fffffffffffffd94 = local_168;
            in_stack_fffffffffffffd98 = iStack_164;
            in_stack_fffffffffffffd9c = local_160;
            sVar7 = strlen((char *)in_stack_fffffffffffffda0);
            (*pcVar1)(in_stack_fffffffffffffd94,in_stack_fffffffffffffd98,in_stack_fffffffffffffd9c,
                      sVar7,in_stack_fffffffffffffda0,*(undefined8 *)(local_20 + 0x1f0));
          }
        }
      }
    } while (local_38 != 0);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1535e1);
  } while( true );
}

Assistant:

static int EventThread(ALCcontext *context)
{
    RingBuffer *ring{context->mAsyncEvents.get()};
    bool quitnow{false};
    while LIKELY(!quitnow)
    {
        auto evt_data = ring->getReadVector().first;
        if(evt_data.len == 0)
        {
            context->mEventSem.wait();
            continue;
        }

        std::lock_guard<std::mutex> _{context->mEventCbLock};
        do {
            auto *evt_ptr = reinterpret_cast<AsyncEvent*>(evt_data.buf);
            evt_data.buf += sizeof(AsyncEvent);
            evt_data.len -= 1;

            AsyncEvent evt{*evt_ptr};
            al::destroy_at(evt_ptr);
            ring->readAdvance(1);

            quitnow = evt.EnumType == EventType_KillThread;
            if UNLIKELY(quitnow) break;

            if(evt.EnumType == EventType_ReleaseEffectState)
            {
                evt.u.mEffectState->release();
                continue;
            }

            ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_acquire)};
            if(!context->mEventCb) continue;

            if(evt.EnumType == EventType_SourceStateChange)
            {
                if(!(enabledevts&EventType_SourceStateChange))
                    continue;
                std::string msg{"Source ID " + std::to_string(evt.u.srcstate.id)};
                msg += " state has changed to ";
                msg += (evt.u.srcstate.state==AL_INITIAL) ? "AL_INITIAL" :
                    (evt.u.srcstate.state==AL_PLAYING) ? "AL_PLAYING" :
                    (evt.u.srcstate.state==AL_PAUSED) ? "AL_PAUSED" :
                    (evt.u.srcstate.state==AL_STOPPED) ? "AL_STOPPED" : "<unknown>";
                context->mEventCb(AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT, evt.u.srcstate.id,
                    static_cast<ALuint>(evt.u.srcstate.state), static_cast<ALsizei>(msg.length()),
                    msg.c_str(), context->mEventParam);
            }
            else if(evt.EnumType == EventType_BufferCompleted)
            {
                if(!(enabledevts&EventType_BufferCompleted))
                    continue;
                std::string msg{std::to_string(evt.u.bufcomp.count)};
                if(evt.u.bufcomp.count == 1) msg += " buffer completed";
                else msg += " buffers completed";
                context->mEventCb(AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT, evt.u.bufcomp.id,
                    evt.u.bufcomp.count, static_cast<ALsizei>(msg.length()), msg.c_str(),
                    context->mEventParam);
            }
            else if((enabledevts&evt.EnumType) == evt.EnumType)
                context->mEventCb(evt.u.user.type, evt.u.user.id, evt.u.user.param,
                    static_cast<ALsizei>(strlen(evt.u.user.msg)), evt.u.user.msg,
                    context->mEventParam);
        } while(evt_data.len != 0);
    }